

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O1

s_profile * ssw_init(int8_t *read,int32_t readLen,int8_t *mat,int32_t n,int8_t score_size)

{
  uint8_t uVar1;
  s_profile *psVar2;
  __m128i *palVar3;
  uint8_t bias;
  ulong uVar4;
  
  psVar2 = (s_profile *)calloc(1,0x30);
  psVar2->bias = '\0';
  psVar2->profile_byte = (__m128i *)0x0;
  psVar2->profile_word = (__m128i *)0x0;
  if ((score_size & 0xfdU) == 0) {
    uVar1 = '\0';
    if (n != 0) {
      uVar4 = 0;
      uVar1 = '\0';
      do {
        if (mat[uVar4] <= (char)uVar1) {
          uVar1 = mat[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (n * n + (uint)(n * n == 0) != uVar4);
    }
    bias = -uVar1;
    if ('\0' < (char)uVar1) {
      bias = uVar1;
    }
    psVar2->bias = bias;
    palVar3 = qP_byte(read,mat,readLen,n,bias);
    psVar2->profile_byte = palVar3;
  }
  if ((byte)(score_size - 1U) < 2) {
    palVar3 = qP_word(read,mat,readLen,n);
    psVar2->profile_word = palVar3;
  }
  psVar2->read = read;
  psVar2->mat = mat;
  psVar2->readLen = readLen;
  psVar2->n = n;
  return psVar2;
}

Assistant:

s_profile* ssw_init (const int8_t* read, const int32_t readLen, const int8_t* mat, const int32_t n, const int8_t score_size) {
	s_profile* p = (s_profile*)calloc(1, sizeof(struct _profile));
	p->profile_byte = 0;
	p->profile_word = 0;
	p->bias = 0;

	if (score_size == 0 || score_size == 2) {
		/* Find the bias to use in the substitution matrix */
		int32_t bias = 0, i;
		for (i = 0; i < n*n; i++) if (mat[i] < bias) bias = mat[i];
		bias = abs(bias);

		p->bias = bias;
		p->profile_byte = qP_byte (read, mat, readLen, n, bias);
	}
	if (score_size == 1 || score_size == 2) p->profile_word = qP_word (read, mat, readLen, n);
	p->read = read;
	p->mat = mat;
	p->readLen = readLen;
	p->n = n;
	return p;
}